

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basisu_comp.cpp
# Opt level: O0

bool __thiscall
basisu::basis_compressor::generate_mipmaps
          (basis_compressor *this,image *img,vector<basisu::image> *mips,bool has_alpha)

{
  bool bVar1;
  uint32_t b;
  uint uVar2;
  uint uVar3;
  uint32_t uVar4;
  value_type *pvVar5;
  byte in_CL;
  image *in_RSI;
  long in_RDI;
  bool status;
  image *pSource_image;
  image *level_img;
  uint32_t level_height;
  uint32_t level_width;
  uint32_t level;
  uint32_t h;
  uint32_t w;
  uint32_t total_levels;
  interval_timer tm;
  uint32_t in_stack_0000259c;
  undefined1 in_stack_000025a3;
  float in_stack_000025a4;
  char *in_stack_000025a8;
  undefined1 in_stack_000025b7;
  image *in_stack_000025b8;
  image *in_stack_000025c0;
  uint32_t in_stack_000025e0;
  undefined4 in_stack_ffffffffffffff58;
  undefined4 in_stack_ffffffffffffff5c;
  undefined4 in_stack_ffffffffffffff60;
  uint32_t in_stack_ffffffffffffff64;
  image *in_stack_ffffffffffffff68;
  value_type *in_stack_ffffffffffffff70;
  image *local_68;
  uint local_48;
  uint local_44;
  
  debug_printf("basis_compressor::generate_mipmaps\n");
  interval_timer::interval_timer((interval_timer *)0x4c18af);
  interval_timer::start
            ((interval_timer *)CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60));
  local_44 = 1;
  local_48 = image::get_width(in_RSI);
  b = image::get_height(in_RSI);
  local_68 = in_stack_ffffffffffffff68;
  while( true ) {
    uVar2 = maximum<unsigned_int>(local_48,b);
    uVar3 = param::operator_cast_to_int((param *)(in_RDI + 0x114));
    if (uVar2 <= uVar3) break;
    local_48 = maximum<unsigned_int>(local_48 >> 1,1);
    b = maximum<unsigned_int>(b >> 1,1);
    local_44 = local_44 + 1;
  }
  uVar2 = 1;
  while( true ) {
    if (local_44 <= uVar2) {
      bVar1 = bool_param::operator_cast_to_bool((bool_param *)(in_RDI + 0x6c));
      if (bVar1) {
        interval_timer::get_elapsed_secs((interval_timer *)local_68);
        debug_printf("Total mipmap generation time: %3.3f secs\n");
      }
      return true;
    }
    uVar4 = image::get_width(in_RSI);
    maximum<unsigned_int>(1,uVar4 >> ((byte)uVar2 & 0x1f));
    uVar4 = image::get_height(in_RSI);
    maximum<unsigned_int>(1,uVar4 >> ((byte)uVar2 & 0x1f));
    pvVar5 = enlarge_vector<basisu::vector<basisu::image>>
                       ((vector<basisu::image> *)
                        CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60),
                        CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58));
    image::resize(in_stack_ffffffffffffff70,(uint32_t)((ulong)local_68 >> 0x20),(uint32_t)local_68,
                  in_stack_ffffffffffffff64,
                  (color_rgba *)CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58));
    bVar1 = bool_param::operator_cast_to_bool((bool_param *)(in_RDI + 0x110));
    local_68 = in_RSI;
    if ((bVar1) && (1 < uVar2)) {
      local_68 = vector<basisu::image>::operator[]
                           ((vector<basisu::image> *)
                            CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60),
                            CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58));
    }
    bVar1 = bool_param::operator_cast_to_bool((bool_param *)(in_RDI + 0x108));
    in_stack_ffffffffffffff64 = CONCAT13(bVar1,(int3)in_stack_ffffffffffffff64);
    std::__cxx11::string::c_str();
    param::operator_cast_to_float((param *)(in_RDI + 0xd0));
    bool_param::operator_cast_to_bool((bool_param *)(in_RDI + 0x10e));
    in_stack_ffffffffffffff58 = 3;
    if ((in_CL & 1) != 0) {
      in_stack_ffffffffffffff58 = 4;
    }
    bVar1 = image_resample(in_stack_000025c0,in_stack_000025b8,(bool)in_stack_000025b7,
                           in_stack_000025a8,in_stack_000025a4,(bool)in_stack_000025a3,
                           in_stack_0000259c,in_stack_000025e0);
    if (!bVar1) break;
    bVar1 = bool_param::operator_cast_to_bool((bool_param *)(in_RDI + 0x10c));
    if (bVar1) {
      image::renormalize_normal_map((image *)CONCAT44(b,uVar2));
    }
    uVar2 = uVar2 + 1;
    in_stack_ffffffffffffff70 = pvVar5;
  }
  error_printf("basis_compressor::generate_mipmaps: image_resample() failed!\n");
  return false;
}

Assistant:

bool basis_compressor::generate_mipmaps(const image &img, basisu::vector<image> &mips, bool has_alpha)
	{
		debug_printf("basis_compressor::generate_mipmaps\n");

		interval_timer tm;
		tm.start();

		uint32_t total_levels = 1;
		uint32_t w = img.get_width(), h = img.get_height();
		while (maximum<uint32_t>(w, h) > (uint32_t)m_params.m_mip_smallest_dimension)
		{
			w = maximum(w >> 1U, 1U);
			h = maximum(h >> 1U, 1U);
			total_levels++;
		}

#if BASISU_USE_STB_IMAGE_RESIZE_FOR_MIPMAP_GEN
		// Requires stb_image_resize
		stbir_filter filter = STBIR_FILTER_DEFAULT;
		if (m_params.m_mip_filter == "box")
			filter = STBIR_FILTER_BOX;
		else if (m_params.m_mip_filter == "triangle")
			filter = STBIR_FILTER_TRIANGLE;
		else if (m_params.m_mip_filter == "cubic")
			filter = STBIR_FILTER_CUBICBSPLINE;
		else if (m_params.m_mip_filter == "catmull")
			filter = STBIR_FILTER_CATMULLROM;
		else if (m_params.m_mip_filter == "mitchell")
			filter = STBIR_FILTER_MITCHELL;

		for (uint32_t level = 1; level < total_levels; level++)
		{
			const uint32_t level_width = maximum<uint32_t>(1, img.get_width() >> level);
			const uint32_t level_height = maximum<uint32_t>(1, img.get_height() >> level);

			image &level_img = *enlarge_vector(mips, 1);
			level_img.resize(level_width, level_height);
						
			int result = stbir_resize_uint8_generic( 
				(const uint8_t *)img.get_ptr(), img.get_width(), img.get_height(), img.get_pitch() * sizeof(color_rgba),
            (uint8_t *)level_img.get_ptr(), level_img.get_width(), level_img.get_height(), level_img.get_pitch() * sizeof(color_rgba),
            has_alpha ? 4 : 3, has_alpha ? 3 : STBIR_ALPHA_CHANNEL_NONE, m_params.m_mip_premultiplied ? STBIR_FLAG_ALPHA_PREMULTIPLIED : 0,
            m_params.m_mip_wrapping ? STBIR_EDGE_WRAP : STBIR_EDGE_CLAMP, filter, m_params.m_mip_srgb ? STBIR_COLORSPACE_SRGB : STBIR_COLORSPACE_LINEAR, 
				nullptr);

			if (result == 0)
			{
				error_printf("basis_compressor::generate_mipmaps: stbir_resize_uint8_generic() failed!\n");
				return false;
			}
			
			if (m_params.m_mip_renormalize)
				level_img.renormalize_normal_map();
		}
#else
		for (uint32_t level = 1; level < total_levels; level++)
		{
			const uint32_t level_width = maximum<uint32_t>(1, img.get_width() >> level);
			const uint32_t level_height = maximum<uint32_t>(1, img.get_height() >> level);

			image& level_img = *enlarge_vector(mips, 1);
			level_img.resize(level_width, level_height);

			const image* pSource_image = &img;

			if (m_params.m_mip_fast)
			{
				if (level > 1)
					pSource_image = &mips[level - 1];
			}

			bool status = image_resample(*pSource_image, level_img, m_params.m_mip_srgb, m_params.m_mip_filter.c_str(), m_params.m_mip_scale, m_params.m_mip_wrapping, 0, has_alpha ? 4 : 3);
			if (!status)
			{
				error_printf("basis_compressor::generate_mipmaps: image_resample() failed!\n");
				return false;
			}

			if (m_params.m_mip_renormalize)
				level_img.renormalize_normal_map();
		}
#endif

		if (m_params.m_debug)
			debug_printf("Total mipmap generation time: %3.3f secs\n", tm.get_elapsed_secs());

		return true;
	}